

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::info_based_rephase(Solver *this)

{
  uint *puVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar2 = (this->vardata).sz;
  uVar4 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    (this->polarity).data[uVar4] =
         (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start[uVar4] == '\0';
  }
  if ((((this->current_heuristic & ~CHB) != VSIDS_DISTANCE) &&
      ((this->ccnr).conflict_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       (this->ccnr).conflict_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start)) && (0 < (this->ccnr)._step)) {
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = (this->ccnr).conflict_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 + 1];
      if (0 < (int)uVar2) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (ulong)uVar2 * 100;
        lVar5 = SUB168(auVar3 / SEXT816((this->ccnr)._step),0);
        if (this->current_heuristic < CHB) {
          varBumpActivity(this,(Var)uVar4,(double)lVar5);
        }
        else {
          if (lVar5 < 2) {
            lVar5 = 1;
          }
          puVar1 = (this->conflicted).data + uVar4;
          *puVar1 = *puVar1 + (int)lVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void Solver::info_based_rephase()
{
    int var_nums = nVars();
    for (int i = 0; i < var_nums; ++i) polarity[i] = !ls_mediation_soln[i];
    if (!considersDISTANCE() && ccnr.conflict_ct.size() > 0 && ccnr._step > 0) {
        for (int i = 0; i < var_nums; ++i) {
            if (ccnr.conflict_ct[i + 1] > 0) {
                if (usesVSIDS()) {
                    varBumpActivity(i, ccnr.conflict_ct[i + 1] * 100 / ccnr._step);
                } else {
                    conflicted[i] += std::max((long long int)1, ccnr.conflict_ct[i + 1] * 100 / ccnr._step);
                }
            }
        }
    }
}